

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O3

void __thiscall IRT::CFrame::AddLocalAddress(CFrame *this,string *name)

{
  int iVar1;
  IAddress *address;
  const_iterator cVar2;
  _func_int **pp_Var3;
  
  address = (IAddress *)operator_new(0x18);
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->localVisibilityAddresses)._M_h,&framePointerAddressName_abi_cxx11_);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pp_Var3 = (_func_int **)0x0;
  }
  else {
    pp_Var3 = *(_func_int ***)
               ((long)cVar2.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>,_true>
                      ._M_cur + 0x28);
  }
  iVar1 = this->maxOffsetFramePointer;
  this->maxOffsetFramePointer = iVar1 + 4;
  address->_vptr_IAddress = (_func_int **)&PTR__IAddress_00180f18;
  address[1]._vptr_IAddress = pp_Var3;
  *(int *)&address[2]._vptr_IAddress = iVar1;
  addAddress(this,name,address);
  return;
}

Assistant:

void CFrame::AddLocalAddress(const std::string &name) {
    const CAddressInFrame *address = new CAddressInFrame(GetFramePointerAddress(), nextOffsetFromFramePointer());
    addAddress(name, address);
}